

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::FileLogger::Init
          (Error *__return_storage_ptr__,FileLogger *this,string *aFilename,LogLevel aLogLevel)

{
  char cVar1;
  FILE *pFVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  writer write;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pFVar2 = fopen((aFilename->_M_dataplus)._M_p,"w");
  if (pFVar2 == (FILE *)0x0) {
    piVar3 = __errno_location();
    if (*piVar3 == 2) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "failed to init file logger \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "failed to init file logger \'{}\', {}";
      write.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      while (pcVar4 != "") {
        cVar1 = *pcVar4;
        pcVar5 = pcVar4;
        while (cVar1 != '{') {
          pcVar5 = pcVar5 + 1;
          if (pcVar5 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
            ::writer::operator()(&write,pcVar4,"");
            goto LAB_00124c22;
          }
          cVar1 = *pcVar5;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
        ::writer::operator()(&write,pcVar4,pcVar5);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                           (pcVar5,"",&local_68);
      }
LAB_00124c22:
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar3);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x23;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"failed to init file logger \'{}\', {}",fmt,args);
      local_90._0_4_ = kNotFound;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    }
    else {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "failed to init file logger \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "failed to init file logger \'{}\', {}";
      write.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      while (pcVar4 != "") {
        cVar1 = *pcVar4;
        pcVar5 = pcVar4;
        while (cVar1 != '{') {
          pcVar5 = pcVar5 + 1;
          if (pcVar5 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
            ::writer::operator()(&write,pcVar4,"");
            goto LAB_00124c82;
          }
          cVar1 = *pcVar5;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
        ::writer::operator()(&write,pcVar4,pcVar5);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                           (pcVar5,"",&local_68);
      }
LAB_00124c82:
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar3);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = (char *)0x23;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"failed to init file logger \'{}\', {}",fmt_00,args_00);
      local_90._0_4_ = kIOError;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    }
    Error::operator=(__return_storage_ptr__,(Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    this->mLogFile = (FILE *)pFVar2;
    this->mLogLevel = aLogLevel;
  }
  return __return_storage_ptr__;
}

Assistant:

Error FileLogger::Init(const std::string &aFilename, LogLevel aLogLevel)
{
    Error error;
    FILE *logFile;

    logFile = fopen(aFilename.c_str(), "w");
    if (logFile == nullptr)
    {
        if (errno == ENOENT)
        {
            ExitNow(error = ERROR_NOT_FOUND("failed to init file logger '{}', {}", aFilename, strerror(errno)));
        }
        else
        {
            ExitNow(error = ERROR_IO_ERROR("failed to init file logger '{}', {}", aFilename, strerror(errno)));
        }
    }

    mLogFile  = logFile;
    mLogLevel = aLogLevel;

exit:
    return error;
}